

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O2

bool __thiscall lan::db::init<int>(db *this,db_bit *context,string *name,int value,db_bit_type type)

{
  bool bVar1;
  db_bit *var;
  string *name_00;
  string local_70;
  string local_50;
  
  this->data = context;
  var = (db_bit *)operator_new(0x50);
  (var->key)._M_dataplus._M_p = (pointer)&(var->key).field_2;
  (var->key)._M_string_length = 0;
  (var->key).field_2._M_local_buf[0] = '\0';
  var->con = (db_bit *)0x0;
  var->data = (void *)0x0;
  var->pre = (db_bit *)0x0;
  var->nex = (db_bit *)0x0;
  var->lin = (db_bit *)0x0;
  context->lin = var;
  if ((int)type < 9) {
    name_00 = &local_50;
    std::__cxx11::string::string((string *)name_00,(string *)name);
    bVar1 = set_bit<int>(this,context,var,name_00,type,value);
  }
  else {
    name_00 = &local_70;
    std::__cxx11::string::string((string *)name_00,(string *)name);
    bVar1 = set_bit(this,context,var,name_00,type);
  }
  std::__cxx11::string::~string((string *)name_00);
  return bVar1;
}

Assistant:

bool init(lan::db_bit * context, std::string const name, any const value, db_bit_type const type){
            data = context;
            data->lin = new db_bit;
            return ((type < lan::Array) ? set_bit(data, data->lin, name, type, value) : set_bit(data, data->lin, name, type));
        }